

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O2

void boost::deflate::deflate_stream_test::testFlushPartial(ICompressor *c)

{
  uint extraout_var;
  uint extraout_var_00;
  string out;
  
  (**c->_vptr_ICompressor)();
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)&out);
  (*c->_vptr_ICompressor[5])(c,"Hello");
  (*c->_vptr_ICompressor[3])(c,5);
  (*c->_vptr_ICompressor[9])(c,out._M_dataplus._M_p);
  (*c->_vptr_ICompressor[7])(c,out._M_string_length);
  (*c->_vptr_ICompressor[0xc])(c,0);
  test_suite::detail::runner::maybe_fail<bool>
            (test_suite::detail::current()::p,(extraout_var & 1) == 0,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1f0,
             "static void boost::deflate::deflate_stream_test::testFlushPartial(ICompressor &)",
             (char *)0x0);
  (*c->_vptr_ICompressor[0xc])(c,2);
  test_suite::detail::runner::maybe_fail<bool>
            (test_suite::detail::current()::p,(extraout_var_00 & 1) == 0,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1f2,
             "static void boost::deflate::deflate_stream_test::testFlushPartial(ICompressor &)",
             (char *)0x0);
  std::__cxx11::string::~string((string *)&out);
  return;
}

Assistant:

static
    void testFlushPartial(ICompressor& c)
    {
        c.init();
        std::string out;
        out.resize(1024);
        string_view s = "Hello";
        c.next_in(s.data());
        c.avail_in(s.size());
        c.next_out(&out.front());
        c.avail_out(out.size());
        error_code ec;
        ec = c.write(Flush::none);
        BOOST_TEST(!ec);
        ec = c.write(Flush::partial);
        BOOST_TEST(!ec);
    }